

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProtoHeader
          (FileGenerator *this,Printer *printer,string *info_path)

{
  FileDescriptor *pFVar1;
  int index;
  string filename_identifier;
  string dependency;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->options_).proto_h == true) {
    FilenameIdentifier(&local_90,*(string **)this->file_);
    GenerateTopHeaderGuard(this,printer,&local_90);
    GenerateLibraryIncludes(this,printer);
    for (index = 0; index < *(int *)(this->file_ + 0x38); index = index + 1) {
      pFVar1 = FileDescriptor::public_dependency(this->file_,index);
      StripProto(&local_70,*(string **)pFVar1);
      std::operator+(&local_50,&local_70,".proto.h");
      std::__cxx11::string::~string((string *)&local_70);
      io::Printer::Print(printer,"#include \"$dependency$\"  // IWYU pragma: export\n","dependency",
                         &local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    GenerateMetadataPragma(this,printer,info_path);
    GenerateHeader(this,printer);
    GenerateBottomHeaderGuard(this,printer,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void FileGenerator::GenerateProtoHeader(io::Printer* printer,
                                        const string& info_path) {
  if (!options_.proto_h) {
    return;
  }

  string filename_identifier = FilenameIdentifier(file_->name());
  GenerateTopHeaderGuard(printer, filename_identifier);


  GenerateLibraryIncludes(printer);

  for (int i = 0; i < file_->public_dependency_count(); i++) {
    const FileDescriptor* dep = file_->public_dependency(i);
    const char* extension = ".proto.h";
    string dependency = StripProto(dep->name()) + extension;
    printer->Print(
      "#include \"$dependency$\"  // IWYU pragma: export\n",
      "dependency", dependency);
  }

  GenerateMetadataPragma(printer, info_path);

  GenerateHeader(printer);

  GenerateBottomHeaderGuard(printer, filename_identifier);
}